

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O3

DWORD __thiscall TSparseArray::GetItemValueAt(TSparseArray *this,size_t index)

{
  _BASEVALS *p_Var1;
  DWORD DVar2;
  ulong uVar3;
  char *__function;
  uint uVar4;
  
  if ((ulong)(this->BaseVals).ItemCount <= index >> 9) {
    __function = "T &TGenericArray<_BASEVALS>::operator[](size_t) [T = _BASEVALS]";
    goto LAB_00116b72;
  }
  p_Var1 = (this->BaseVals).ItemArray + (index >> 9);
  DVar2 = p_Var1->BaseValue200;
  switch((uint)(index >> 6) & 7) {
  case 1:
    uVar4 = *(uint *)&p_Var1->field_0x4 & 0x7f;
    goto LAB_00116a37;
  case 2:
    uVar4 = *(uint *)&p_Var1->field_0x4 >> 7;
    goto LAB_00116a34;
  case 3:
    uVar4 = *(uint *)&p_Var1->field_0x4 >> 0xf;
LAB_00116a34:
    uVar4 = uVar4 & 0xff;
    goto LAB_00116a37;
  case 4:
    uVar4 = *(uint *)&p_Var1->field_0x4 >> 0x17;
LAB_00116a37:
    DVar2 = DVar2 + uVar4;
    break;
  case 5:
    DVar2 = DVar2 + (*(uint *)&p_Var1->field_0x8 & 0x1ff);
    break;
  case 6:
    uVar4 = (uint)((ulong)*(undefined8 *)&p_Var1->field_0x4 >> 0x29);
    goto LAB_00116a59;
  case 7:
    uVar4 = (uint)((ulong)*(undefined8 *)&p_Var1->field_0x4 >> 0x32);
LAB_00116a59:
    DVar2 = (uVar4 & 0x1ff) + DVar2;
  }
  if ((index & 0x20) == 0) {
    uVar3 = (ulong)(this->ItemBits).ItemCount;
LAB_00116ae2:
    if (index >> 5 < uVar3) {
      uVar4 = ~(-1 << ((byte)index & 0x1f)) & (this->ItemBits).ItemArray[index >> 5];
      uVar4 = (uVar4 & 0x55555555) + (uVar4 >> 1 & 0x15555555);
      uVar4 = (uVar4 & 0x33333333) + (uVar4 >> 2 & 0x13333333);
      return (((uVar4 & 0x7070707) + (uVar4 >> 4 & 0x7070707)) * 0x1010101 >> 0x18) + DVar2;
    }
  }
  else {
    uVar3 = (ulong)(this->ItemBits).ItemCount;
    if ((index >> 5) - 1 < uVar3) {
      uVar4 = (this->ItemBits).ItemArray[(index >> 5) - 1];
      uVar4 = (uVar4 & 0x55555555) + (uVar4 >> 1 & 0x55555555);
      uVar4 = (uVar4 & 0x33333333) + (uVar4 >> 2 & 0x33333333);
      DVar2 = DVar2 + (((uVar4 & 0x7070707) + (uVar4 >> 4 & 0x7070707)) * 0x1010101 >> 0x18);
      goto LAB_00116ae2;
    }
  }
  __function = "T &TGenericArray<unsigned int>::operator[](size_t) [T = unsigned int]";
LAB_00116b72:
  __assert_fail("index < ItemCount",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/CascRootFile_MNDX.cpp"
                ,0x1d0,__function);
}

Assistant:

DWORD GetItemValueAt(size_t index)
    {
        BASEVALS & SetBitsCount = BaseVals[index >> 0x09];
        DWORD IntValue;
        DWORD BitMask;

        //
        // Since we don't want to count bits for the entire array,
        // there are item value shortcuts every 0x200 items,
        // and then every 0x40 items above the 0x200 base
        //

        // 1) We have base value for every 0x200-th item
        IntValue = SetBitsCount.BaseValue200;

        // 2) Add the base value for each 0x40-th item above the 0x200 base
        switch(((index >> 0x06) & 0x07) - 1)
        {
            case 0:     // Add the 1st value (7 bits)
                IntValue += SetBitsCount.AddValue40;
                break;

            case 1:     // Add the 2nd value (8 bits)
                IntValue += SetBitsCount.AddValue80;
                break;

            case 2:     // Add the 3rd value (8 bits)
                IntValue += SetBitsCount.AddValueC0;
                break;

            case 3:     // Add the 4th value (9 bits)
                IntValue += SetBitsCount.AddValue100;
                break;

            case 4:     // Add the 5th value (9 bits)
                IntValue += SetBitsCount.AddValue140;
                break;

            case 5:     // Add the 6th value (9 bits)
                IntValue += SetBitsCount.AddValue180;
                break;

            case 6:     // Add the 7th value (9 bits)
                IntValue += SetBitsCount.AddValue1C0;
                break;
        }

        // 3) Count the bits of the higher DWORD, if the index 0x20 - 0x30 above the 0x200 base
        if(index & 0x20)
            IntValue += GetNumberOfSetBits32(ItemBits[(index >> 0x05) - 1]);

        // 4) Count the bits in the current DWORD (masked by bit index mask) 
        BitMask = (1 << (index & 0x1F)) - 1;
        return IntValue + GetNumberOfSetBits32(ItemBits[index >> 0x05] & BitMask);
    }